

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tdiv<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  undefined8 *puVar3;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  if (iVar1 != 0) {
    PUSH<int>(this,iVar2 / iVar1);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00123ce8;
  __cxa_throw(puVar3,&DivideByZero::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tdiv() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_integral_v<T>) {
        if (rhs == 0) {
            throw DivideByZero();
        }
    }
    PUSH(lhs/rhs);
}